

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::SliderBehaviorT<unsigned_int,int,float>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,uint *v,uint v_min,uint v_max,
               char *format,float power,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  float fVar1;
  ImGuiContext *pIVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  bool bVar8;
  uint uVar9;
  ImVec2 IVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  pIVar2 = GImGui;
  uVar7 = -(v_min - v_max);
  uVar4 = v_min - v_max;
  if (v_min < v_max) {
    uVar4 = uVar7;
  }
  uVar6 = (ulong)(flags & 1);
  uVar5 = data_type & 0xfffffffe;
  bVar8 = uVar5 == 8;
  fVar13 = (&(bb->Min).x)[uVar6];
  fVar1 = (&(bb->Max).x)[uVar6];
  fVar14 = (fVar1 - fVar13) + -4.0;
  fVar12 = (GImGui->Style).GrabMinSize;
  if (-1 < (int)uVar4 && !bVar8) {
    fVar11 = fVar14 / (float)(int)(uVar4 + 1);
    uVar9 = -(uint)(fVar12 <= fVar11);
    fVar12 = (float)(~uVar9 & (uint)fVar12 | (uint)fVar11 & uVar9);
  }
  if (fVar14 <= fVar12) {
    fVar12 = fVar14;
  }
  fVar13 = fVar13 + 2.0 + fVar12 * 0.5;
  if (GImGui->ActiveId == id) {
    if (GImGui->ActiveIdSource == ImGuiInputSource_Nav) {
      IVar10 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.0,0.0);
      fVar11 = IVar10.x;
      if (uVar6 != 0) {
        fVar11 = -IVar10.y;
      }
      if ((pIVar2->NavActivatePressedId == id) && (pIVar2->ActiveIdIsJustActivated == false)) {
        ClearActiveID();
      }
      else if ((fVar11 != 0.0) || (NAN(fVar11))) {
        fVar15 = SliderCalcRatioFromValueT<unsigned_int,float>(data_type,*v,v_min,v_max,power,0.0);
        if ((uVar5 != 8) ||
           (iVar3 = ImParseFormatPrecision(format,3), (bool)(~(bVar8 && power != 1.0) & iVar3 < 1)))
        {
          if ((uVar4 + 100 < 0xc9) || (0.0 < (GImGui->IO).NavInputs[0xe])) {
            fVar11 = *(float *)(&DAT_00159818 + (ulong)(fVar11 < 0.0) * 4) / (float)(int)uVar4;
          }
          else {
            fVar11 = fVar11 / 100.0;
          }
        }
        else {
          fVar11 = fVar11 / 100.0;
          if (0.0 < (GImGui->IO).NavInputs[0xe]) {
            fVar11 = fVar11 / 10.0;
          }
        }
        uVar4 = -(uint)(0.0 < (GImGui->IO).NavInputs[0xf]);
        fVar11 = (float)(~uVar4 & (uint)fVar11 | (uint)(fVar11 * 10.0) & uVar4);
        if ((1.0 <= fVar15) && (0.0 < fVar11)) {
          bVar8 = false;
          goto LAB_0014f946;
        }
        if ((0.0 < fVar15) || (0.0 <= fVar11)) {
          fVar15 = fVar15 + fVar11;
          fVar11 = 1.0;
          if (fVar15 <= 1.0) {
            fVar11 = fVar15;
          }
          fVar11 = (float)(~-(uint)(fVar15 < 0.0) & (uint)fVar11);
          goto LAB_0014f7eb;
        }
        goto LAB_0014f6a3;
      }
      bVar8 = false;
      goto LAB_0014f946;
    }
    if (GImGui->ActiveIdSource == ImGuiInputSource_Mouse) {
      if ((GImGui->IO).MouseDown[0] != false) {
        fVar11 = 0.0;
        if (0.0 < fVar14 - fVar12) {
          fVar15 = (*(float *)((GImGui->IO).MouseDown + uVar6 * 4 + -8) - fVar13) /
                   (fVar14 - fVar12);
          fVar11 = 1.0;
          if (fVar15 <= 1.0) {
            fVar11 = fVar15;
          }
          fVar11 = (float)(~-(uint)(fVar15 < 0.0) & (uint)fVar11);
        }
        if (uVar6 != 0) {
          fVar11 = 1.0 - fVar11;
        }
LAB_0014f7eb:
        if (bVar8 && power != 1.0) {
          if (0.0 <= fVar11) {
            fVar11 = powf(fVar11,power);
            fVar11 = (float)uVar7 * fVar11 + (float)v_min;
          }
          else {
            fVar11 = powf(1.0 - fVar11 / 0.0,power);
            fVar11 = (float)v_min * fVar11 + 0.0;
          }
          uVar4 = (uint)(long)fVar11;
        }
        else if (uVar5 == 8) {
          uVar4 = (uint)(long)((float)uVar7 * fVar11 + (float)v_min);
        }
        else {
          uVar5 = (uint)(long)(fVar11 * (float)uVar7);
          uVar4 = (uint)(long)(fVar11 * (float)uVar7 + 0.5);
          if (uVar4 < uVar5) {
            uVar4 = uVar5;
          }
          uVar4 = uVar4 + v_min;
        }
        uVar4 = RoundScalarWithFormatT<unsigned_int,int>(format,data_type,uVar4);
        bVar8 = *v != uVar4;
        if (bVar8) {
          *v = uVar4;
        }
        goto LAB_0014f946;
      }
      ClearActiveID();
LAB_0014f6a3:
      bVar8 = false;
      goto LAB_0014f946;
    }
  }
  bVar8 = false;
LAB_0014f946:
  if (1.0 <= fVar14) {
    fVar14 = SliderCalcRatioFromValueT<unsigned_int,float>(data_type,*v,v_min,v_max,power,0.0);
    if (uVar6 != 0) {
      fVar14 = 1.0 - fVar14;
    }
    fVar13 = (((fVar1 + -2.0) - fVar12 * 0.5) - fVar13) * fVar14 + fVar13;
    if (uVar6 == 0) {
      fVar1 = (bb->Min).y;
      fVar14 = (bb->Max).y;
      (out_grab_bb->Min).x = -fVar12 * 0.5 + fVar13;
      (out_grab_bb->Min).y = fVar1 + 2.0;
      (out_grab_bb->Max).x = fVar12 * 0.5 + fVar13;
      (out_grab_bb->Max).y = fVar14 + -2.0;
    }
    else {
      fVar1 = (bb->Max).x;
      (out_grab_bb->Min).x = (bb->Min).x + 2.0;
      (out_grab_bb->Min).y = -fVar12 * 0.5 + fVar13;
      (out_grab_bb->Max).x = fVar1 + -2.0;
      (out_grab_bb->Max).y = fVar12 * 0.5 + fVar13;
    }
  }
  else {
    IVar10 = bb->Min;
    out_grab_bb->Min = IVar10;
    out_grab_bb->Max = IVar10;
  }
  return bVar8;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_power = (power != 1.0f) && is_decimal;

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_decimal && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    // For power curve sliders that cross over sign boundary we want the curve to be symmetric around 0.0f
    float linear_zero_pos;   // 0.0->1.0f
    if (is_power && v_min * v_max < 0.0f)
    {
        // Different sign
        const FLOATTYPE linear_dist_min_to_0 = ImPow(v_min >= 0 ? (FLOATTYPE)v_min : -(FLOATTYPE)v_min, (FLOATTYPE)1.0f / power);
        const FLOATTYPE linear_dist_max_to_0 = ImPow(v_max >= 0 ? (FLOATTYPE)v_max : -(FLOATTYPE)v_max, (FLOATTYPE)1.0f / power);
        linear_zero_pos = (float)(linear_dist_min_to_0 / (linear_dist_min_to_0 + linear_dist_max_to_0));
    }
    else
    {
        // Same sign
        linear_zero_pos = v_min < 0.0f ? 1.0f : 0.0f;
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            const ImVec2 delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float delta = (axis == ImGuiAxis_X) ? delta2.x : -delta2.y;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (delta != 0.0f)
            {
                clicked_t = SliderCalcRatioFromValueT<TYPE,FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
                const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
                if ((decimal_precision > 0) || is_power)
                {
                    delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta = ((delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    delta *= 10.0f;
                set_new_value = true;
                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                    set_new_value = false;
                else
                    clicked_t = ImSaturate(clicked_t + delta);
            }
        }

        if (set_new_value)
        {
            TYPE v_new;
            if (is_power)
            {
                // Account for power curve scale on both sides of the zero
                if (clicked_t < linear_zero_pos)
                {
                    // Negative: rescale to the negative range before powering
                    float a = 1.0f - (clicked_t / linear_zero_pos);
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMin(v_max, (TYPE)0), v_min, a);
                }
                else
                {
                    // Positive: rescale to the positive range before powering
                    float a;
                    if (ImFabs(linear_zero_pos - 1.0f) > 1.e-6f)
                        a = (clicked_t - linear_zero_pos) / (1.0f - linear_zero_pos);
                    else
                        a = clicked_t;
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMax(v_min, (TYPE)0), v_max, a);
                }
            }
            else
            {
                // Linear slider
                if (is_decimal)
                {
                    v_new = ImLerp(v_min, v_max, clicked_t);
                }
                else
                {
                    // For integer values we want the clicking position to match the grab box so we round above
                    // This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
                    FLOATTYPE v_new_off_f = (v_max - v_min) * clicked_t;
                    TYPE v_new_off_floor = (TYPE)(v_new_off_f);
                    TYPE v_new_off_round = (TYPE)(v_new_off_f + (FLOATTYPE)0.5);
                    if (!is_decimal && v_new_off_floor < v_new_off_round)
                        v_new = v_min + v_new_off_round;
                    else
                        v_new = v_min + v_new_off_floor;
                }
            }

            // Round to user desired precision based on format string
            v_new = RoundScalarWithFormatT<TYPE,SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = SliderCalcRatioFromValueT<TYPE, FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}